

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
SMBusSimulationDataGenerator::OutputPMBusGroupCommand(SMBusSimulationDataGenerator *this)

{
  char cVar1;
  
  OutputStart(this);
  OutputByte(this,0x86,true);
  OutputByte(this,'%',true);
  OutputByte(this,'\x01',true);
  OutputByte(this,'$',true);
  cVar1 = AnalyzerSettingInterfaceBool::GetValue();
  if (cVar1 != '\0') {
    OutputByte(this,'/',true);
  }
  OutputStart(this);
  OutputByte(this,0x88,true);
  OutputByte(this,'%',true);
  OutputByte(this,'s',true);
  OutputByte(this,'(',true);
  cVar1 = AnalyzerSettingInterfaceBool::GetValue();
  if (cVar1 != '\0') {
    OutputByte(this,'G',true);
  }
  OutputStart(this);
  OutputByte(this,0x8a,true);
  OutputByte(this,'%',true);
  OutputByte(this,'$',true);
  OutputByte(this,0x88,true);
  cVar1 = AnalyzerSettingInterfaceBool::GetValue();
  if (cVar1 != '\0') {
    OutputByte(this,'e',true);
  }
  OutputStart(this);
  OutputByte(this,0x8c,true);
  OutputByte(this,' ',true);
  OutputByte(this,'\x11',true);
  cVar1 = AnalyzerSettingInterfaceBool::GetValue();
  if (cVar1 != '\0') {
    OutputByte(this,'(',true);
  }
  OutputStop(this);
  ClockGenerator::AdvanceByTimeS(0.0005);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputPMBusGroupCommand()
{
    U8 pec;

    OutputStart();
    pec = 0;
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( VOUT_MARGIN_HIGH ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x01 ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x24 ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec );

    OutputStart();
    pec = 0;
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x44, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( VOUT_MARGIN_HIGH ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x73 ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x28 ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec );

    OutputStart();
    pec = 0;
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x45, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( VOUT_MARGIN_HIGH ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x24 ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x88 ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec );

    OutputStart();
    pec = 0;
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x46, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( VOUT_MODE ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x11 ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec );

    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}